

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

char * el::base::utils::Str::convertAndAddToBuff
                 (size_t n,int len,char *buf,char *bufLim,bool zeroPadded)

{
  char *pcVar1;
  char cStack_11;
  char localBuff [10];
  
  localBuff[8] = '\0';
  localBuff[9] = '\0';
  localBuff[0] = '\0';
  localBuff[1] = '\0';
  localBuff[2] = '\0';
  localBuff[3] = '\0';
  localBuff[4] = '\0';
  localBuff[5] = '\0';
  localBuff[6] = '\0';
  localBuff[7] = '\0';
  if (n == 0) {
    pcVar1 = localBuff + 7;
    localBuff[0] = '\0';
    localBuff[1] = '\0';
    localBuff[2] = '\0';
    localBuff[3] = '\0';
    localBuff[4] = '\0';
    localBuff[5] = '\0';
    localBuff[6] = '\0';
    localBuff[7] = '0';
    len = len + -1;
  }
  else {
    pcVar1 = localBuff + 8;
    for (; ((n != 0 && (localBuff < pcVar1)) && (0 < len)); len = len + -1) {
      pcVar1[-1] = (byte)(n % 10) | 0x30;
      pcVar1 = pcVar1 + -1;
      n = n / 10;
    }
  }
  if (zeroPadded && localBuff < pcVar1) {
    do {
      if (len < 1) break;
      len = len + -1;
      pcVar1[-1] = '0';
      pcVar1 = pcVar1 + -1;
    } while (localBuff < pcVar1);
  }
  pcVar1 = addToBuff(pcVar1,buf,bufLim);
  return pcVar1;
}

Assistant:

char* Str::convertAndAddToBuff(std::size_t n, int len, char* buf, const char* bufLim, bool zeroPadded) {
  char localBuff[10] = "";
  char* p = localBuff + sizeof(localBuff) - 2;
  if (n > 0) {
    for (; n > 0 && p > localBuff && len > 0; n /= 10, --len)
      *--p = static_cast<char>(n % 10 + '0');
  } else {
    *--p = '0';
    --len;
  }
  if (zeroPadded)
    while (p > localBuff && len-- > 0) *--p = static_cast<char>('0');
  return addToBuff(p, buf, bufLim);
}